

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant_impl.hpp
# Opt level: O2

bool type_safe::detail::
     compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_>
     ::compare_less(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *a
                   ,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *b
                   )

{
  less_visitor v;
  undefined1 local_9;
  
  if ((a->storage_).storage_.cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ != 0) {
    local_9 = 0;
    with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>::less_visitor&,type_safe::tagged_union<int,double,debugger_type>const&,type_safe::union_types<int,double,debugger_type>,type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
    ::with_impl<int,double,debugger_type>(a,&local_9);
    return (bool)local_9;
  }
  return (b->storage_).storage_.cur_type_.
         super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
         .value_ != 0;
}

Assistant:

static bool compare_less(const Variant& a, const Variant& b)
        {
            if (!a.has_value())
                // for a to be less than b,
                // b must have a value
                return b.has_value();

            less_visitor v;
            with(a, v, b);
            return v.result;
        }